

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O0

void test_bson_as_json_stack_overflow(void)

{
  byte bVar1;
  int __fd;
  ssize_t sVar2;
  char *__haystack;
  char *pcVar3;
  ssize_t r;
  int fd;
  char *str;
  size_t buflen;
  bson_t b;
  uint8_t *buf;
  undefined1 local_180 [232];
  void *local_98;
  
  local_98 = (void *)bson_malloc0(0x1100000);
  __fd = open("/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/stackoverflow.bson"
              ,0);
  if (__fd == -1) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x297,"test_bson_as_json_stack_overflow","-1 != fd");
    abort();
  }
  sVar2 = read(__fd,local_98,0x1100000);
  if (sVar2 != 0x1000004) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x29a,"test_bson_as_json_stack_overflow","r == 16777220");
    abort();
  }
  bVar1 = bson_init_static(local_180,local_98,0x1000004);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x29d,"test_bson_as_json_stack_overflow","r");
    abort();
  }
  __haystack = (char *)bson_as_json(local_180,0);
  if (__haystack == (char *)0x0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x2a0,"test_bson_as_json_stack_overflow","str");
    abort();
  }
  pcVar3 = strstr(__haystack,"...");
  if (pcVar3 == (char *)0x0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x2a3,"test_bson_as_json_stack_overflow","r");
    abort();
  }
  bson_free(__haystack);
  bson_destroy(local_180);
  bson_free(local_98);
  return;
}

Assistant:

static void
test_bson_as_json_stack_overflow (void)
{
   uint8_t *buf;
   bson_t b;
   size_t buflen = 1024 * 1024 * 17;
   char *str;
   int fd;
   ssize_t r;

   buf = bson_malloc0 (buflen);

   fd = bson_open (BINARY_DIR "/stackoverflow.bson", O_RDONLY);
   BSON_ASSERT (-1 != fd);

   r = bson_read (fd, buf, buflen);
   BSON_ASSERT (r == 16777220);

   r = bson_init_static (&b, buf, 16777220);
   BSON_ASSERT (r);

   str = bson_as_json (&b, NULL);
   BSON_ASSERT (str);

   r = !!strstr (str, "...");
   BSON_ASSERT (r);

   bson_free (str);
   bson_destroy (&b);
   bson_free (buf);
}